

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

void start_subcommand(strbuf *args)

{
  int iVar1;
  __pid_t _Var2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  void *unaff_R14;
  char *__s;
  
  iVar1 = pipe(signalpipe);
  if (iVar1 < 0) {
    start_subcommand_cold_3();
  }
  else {
    putty_signal(0x11,sigchld);
    if (args->len == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      sVar4 = 0;
      do {
        lVar6 = lVar6 + (ulong)(args->s[sVar4] == '\0');
        sVar4 = sVar4 + 1;
      } while (args->len != sVar4);
    }
    unaff_R14 = safemalloc(lVar6 + 1,8,0);
    if (lVar6 != 0) {
      __s = args->s;
      sVar4 = args->len;
      lVar5 = 0;
      do {
        *(char **)((long)unaff_R14 + lVar5 * 8) = __s;
        pcVar3 = (char *)strlen(__s);
        if (args->s + (sVar4 - (long)__s) <= pcVar3) {
          __assert_fail("len < args->len - (p - args->s)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/psocks.c"
                        ,0x6f,"void start_subcommand(strbuf *)");
        }
        __s = __s + (long)(pcVar3 + 1);
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
    *(undefined8 *)((long)unaff_R14 + lVar6 * 8) = 0;
    _Var2 = fork();
    if (-1 < _Var2) {
      if (_Var2 != 0) {
        subcommand_pid = _Var2;
        safefree(unaff_R14);
        return;
      }
      goto LAB_001042b1;
    }
  }
  start_subcommand_cold_2();
LAB_001042b1:
  start_subcommand_cold_1();
  lVar6 = -0x20;
  do {
    pclose(*(FILE **)((long)unaff_R14 + lVar6 + -0x20));
    lVar6 = lVar6 + 0x20;
  } while (lVar6 == 0);
  safefree((void *)((long)unaff_R14 + -0x40));
  return;
}

Assistant:

static void start_subcommand(strbuf *args)
{
    pid_t pid;

    /*
     * Set up the pipe we'll use to tell us about SIGCHLD.
     */
    if (pipe(signalpipe) < 0) {
        perror("pipe");
        exit(1);
    }
    putty_signal(SIGCHLD, sigchld);

    /*
     * Make an array of argument pointers that execvp will like.
     */
    size_t nargs = 0;
    for (size_t i = 0; i < args->len; i++)
        if (args->s[i] == '\0')
            nargs++;

    char **exec_args = snewn(nargs + 1, char *);
    char *p = args->s;
    for (size_t a = 0; a < nargs; a++) {
        exec_args[a] = p;
        size_t len = strlen(p);
        assert(len < args->len - (p - args->s));
        p += 1 + len;
    }
    exec_args[nargs] = NULL;

    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    } else if (pid == 0) {
        execvp(exec_args[0], exec_args);
        perror("exec");
        _exit(127);
    } else {
        subcommand_pid = pid;
        sfree(exec_args);
    }
}